

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

uint64_t __thiscall
RandomMixin<FastRandomContext>::randbits<31>(RandomMixin<FastRandomContext> *this)

{
  long lVar1;
  uint64_t uVar2;
  ulong uVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->bitbuf_size < 0x1f) {
    uVar2 = FastRandomContext::rand64((FastRandomContext *)this);
    bVar4 = (byte)this->bitbuf_size;
    uVar3 = uVar2 << (bVar4 & 0x3f) | this->bitbuf;
    uVar6 = uVar2 >> (0x1f - bVar4 & 0x3f);
    iVar5 = this->bitbuf_size + 0x21;
  }
  else {
    uVar3 = this->bitbuf;
    uVar6 = uVar3 >> 0x1f;
    iVar5 = this->bitbuf_size + -0x1f;
  }
  this->bitbuf = uVar6;
  this->bitbuf_size = iVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (ulong)((uint)uVar3 & 0x7fffffff);
  }
  __stack_chk_fail();
}

Assistant:

uint64_t randbits() noexcept
    {
        static_assert(Bits >= 0 && Bits <= 64);
        if constexpr (Bits == 64) {
            return Impl().rand64();
        } else {
            uint64_t ret;
            if (Bits <= bitbuf_size) {
                ret = bitbuf;
                bitbuf >>= Bits;
                bitbuf_size -= Bits;
            } else {
                uint64_t gen = Impl().rand64();
                ret = (gen << bitbuf_size) | bitbuf;
                bitbuf = gen >> (Bits - bitbuf_size);
                bitbuf_size = 64 + bitbuf_size - Bits;
            }
            constexpr uint64_t MASK = (uint64_t{1} << Bits) - 1;
            return ret & MASK;
        }
    }